

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

void __thiscall icu_63::RegexCompile::nextChar(RegexCompile *this,RegexPatternChar *c)

{
  int iVar1;
  uint uVar2;
  UText *pUVar3;
  UBool UVar4;
  UChar32 UVar5;
  int64_t iVar6;
  long lVar7;
  int iVar8;
  long index;
  UnicodeSet *this_00;
  uint uVar9;
  bool bVar10;
  int32_t offset;
  int32_t endIndex;
  uint local_3c;
  UText *local_38;
  uint local_30;
  
  pUVar3 = this->fRXPat->fPattern;
  if (pUVar3->nativeIndexingLimit < pUVar3->chunkOffset) {
    iVar6 = (*pUVar3->pFuncs->mapOffsetToNative)(pUVar3);
  }
  else {
    iVar6 = (long)pUVar3->chunkOffset + pUVar3->chunkNativeStart;
  }
  this->fScanIndex = iVar6;
  UVar5 = nextCharLL(this);
  c->fChar = UVar5;
  c->fQuoted = '\0';
  if (this->fQuoteMode == '\0') {
    if (this->fInBackslashQuote != '\0') {
      this->fInBackslashQuote = '\0';
      goto LAB_00269948;
    }
    if ((this->fModeFlags & 4) != 0) {
      do {
        if (c->fChar == 0x23) {
          if (this->fEOLComments == '\x01') {
            do {
              UVar5 = nextCharLL(this);
              c->fChar = UVar5;
              if (((UVar5 + 1U < 0xf) && ((0x4801U >> (UVar5 + 1U & 0x1f) & 1) != 0)) ||
                 (UVar5 == 0x2028)) break;
            } while (UVar5 != 0x85);
          }
        }
        else if (c->fChar == -1) break;
        UVar4 = PatternProps::isWhiteSpace(c->fChar);
        if (UVar4 == '\0') break;
        UVar5 = nextCharLL(this);
        c->fChar = UVar5;
      } while( true );
    }
    if (c->fChar != 0x5c) goto LAB_00269948;
    pUVar3 = this->fRXPat->fPattern;
    if (pUVar3->nativeIndexingLimit < pUVar3->chunkOffset) {
      iVar6 = (*pUVar3->pFuncs->mapOffsetToNative)(pUVar3);
    }
    else {
      iVar6 = (long)pUVar3->chunkOffset + pUVar3->chunkNativeStart;
    }
    this_00 = (UnicodeSet *)(RegexStaticSets::gStaticSets + 0x578);
    if (this->fPeekChar == -1) {
      UVar5 = nextCharLL(this);
      this->fPeekChar = UVar5;
    }
    UVar4 = UnicodeSet::contains(this_00,this->fPeekChar);
    if (UVar4 != '\0') {
      nextCharLL(this);
      c->fQuoted = '\x01';
      pUVar3 = this->fRXPat->fPattern;
      if (((pUVar3->chunkNativeStart == 0) &&
          (lVar7 = this->fPatternLength, lVar7 == pUVar3->chunkNativeLimit)) &&
         (lVar7 == pUVar3->nativeIndexingLimit)) {
        local_38 = (UText *)CONCAT44(local_38._4_4_,(int)iVar6);
        UVar5 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,(int32_t *)&local_38,(int32_t)lVar7,
                                pUVar3->chunkContents);
        c->fChar = UVar5;
        if (iVar6 == (int)local_38) {
          error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
        }
        index = (long)(int)local_38;
        this->fCharNum = this->fCharNum + (index - iVar6);
        pUVar3 = this->fRXPat->fPattern;
        lVar7 = index - pUVar3->chunkNativeStart;
        if (((lVar7 < 0) || (pUVar3->nativeIndexingLimit <= lVar7)) ||
           (0xdbff < (ushort)pUVar3->chunkContents[lVar7])) {
          utext_setNativeIndex_63(pUVar3,index);
        }
        else {
          pUVar3->chunkOffset = (int32_t)lVar7;
        }
      }
      else {
        local_3c = 0;
        local_38 = this->fRXPat->fPattern;
        local_30 = 0xffffffff;
        lVar7 = iVar6 - local_38->chunkNativeStart;
        if (((lVar7 < 0) || (local_38->nativeIndexingLimit <= lVar7)) ||
           (0xdbff < (ushort)local_38->chunkContents[lVar7])) {
          utext_setNativeIndex_63(local_38,iVar6);
        }
        else {
          local_38->chunkOffset = (int32_t)lVar7;
        }
        UVar5 = u_unescapeAt_63(uregex_utext_unescape_charAt_63,(int32_t *)&local_3c,0x7fffffff,
                                &local_38);
        c->fChar = UVar5;
        if (local_3c == 0) {
          error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
        }
        else if (local_30 == local_3c) {
          pUVar3 = this->fRXPat->fPattern;
          iVar8 = pUVar3->chunkOffset;
          if (((long)iVar8 < 1) || (0xd7ff < (ushort)pUVar3->chunkContents[(long)iVar8 + -1])) {
            utext_previous32_63(pUVar3);
          }
          else {
            pUVar3->chunkOffset = iVar8 + -1;
          }
        }
        else if (local_30 != local_3c - 1) {
          utext_moveIndex32_63(this->fRXPat->fPattern,local_3c + ~local_30);
        }
        this->fCharNum = this->fCharNum + (long)(int)local_3c;
      }
      goto LAB_00269948;
    }
    if (this->fPeekChar == -1) {
      UVar5 = nextCharLL(this);
      this->fPeekChar = UVar5;
    }
    if (this->fPeekChar == -1) {
      UVar5 = nextCharLL(this);
      this->fPeekChar = UVar5;
    }
    else if (this->fPeekChar == 0x30) {
      c->fChar = 0;
      nextCharLL(this);
      iVar8 = 2;
      do {
        if (this->fPeekChar == -1) {
          UVar5 = nextCharLL(this);
          this->fPeekChar = UVar5;
        }
        uVar9 = this->fPeekChar & 0xfffffff8;
        if (uVar9 == 0x30) {
          uVar2 = c->fChar;
          iVar1 = (this->fPeekChar & 7U) + uVar2 * 8;
          c->fChar = iVar1;
          if (iVar1 < 0x100) {
            nextCharLL(this);
          }
          else {
            c->fChar = uVar2 & 0x1fffffff;
          }
        }
        else if (iVar8 == 2) {
          error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
        }
        bVar10 = iVar8 != 0;
        iVar8 = iVar8 + -1;
      } while ((uVar9 == 0x30) && (bVar10));
      c->fQuoted = '\x01';
      goto LAB_00269948;
    }
    if (this->fPeekChar != 0x51) {
      this->fInBackslashQuote = '\x01';
      goto LAB_00269948;
    }
    this->fQuoteMode = '\x01';
  }
  else {
    c->fQuoted = '\x01';
    if (UVar5 == 0x5c) {
      if (this->fPeekChar == -1) {
        UVar5 = nextCharLL(this);
        this->fPeekChar = UVar5;
      }
      if ((this->fPeekChar != 0x45) || ((this->fModeFlags & 0x10) != 0)) goto LAB_002695ea;
    }
    else {
LAB_002695ea:
      if (c->fChar != -1) goto LAB_00269948;
    }
    this->fQuoteMode = '\0';
  }
  nextCharLL(this);
  nextChar(this,c);
LAB_00269948:
  this->fEOLComments = '\x01';
  return;
}

Assistant:

void RegexCompile::nextChar(RegexPatternChar &c) {

    fScanIndex = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
    c.fChar    = nextCharLL();
    c.fQuoted  = FALSE;

    if (fQuoteMode) {
        c.fQuoted = TRUE;
        if ((c.fChar==chBackSlash && peekCharLL()==chE && ((fModeFlags & UREGEX_LITERAL) == 0)) ||
            c.fChar == (UChar32)-1) {
            fQuoteMode = FALSE;  //  Exit quote mode,
            nextCharLL();        // discard the E
            nextChar(c);         // recurse to get the real next char
        }
    }
    else if (fInBackslashQuote) {
        // The current character immediately follows a '\'
        // Don't check for any further escapes, just return it as-is.
        // Don't set c.fQuoted, because that would prevent the state machine from
        //    dispatching on the character.
        fInBackslashQuote = FALSE;
    }
    else
    {
        // We are not in a \Q quoted region \E of the source.
        //
        if (fModeFlags & UREGEX_COMMENTS) {
            //
            // We are in free-spacing and comments mode.
            //  Scan through any white space and comments, until we
            //  reach a significant character or the end of inut.
            for (;;) {
                if (c.fChar == (UChar32)-1) {
                    break;     // End of Input
                }
                if  (c.fChar == chPound && fEOLComments == TRUE) {
                    // Start of a comment.  Consume the rest of it, until EOF or a new line
                    for (;;) {
                        c.fChar = nextCharLL();
                        if (c.fChar == (UChar32)-1 ||  // EOF
                            c.fChar == chCR        ||
                            c.fChar == chLF        ||
                            c.fChar == chNEL       ||
                            c.fChar == chLS)       {
                            break;
                        }
                    }
                }
                // TODO:  check what Java & Perl do with non-ASCII white spaces.  Ticket 6061.
                if (PatternProps::isWhiteSpace(c.fChar) == FALSE) {
                    break;
                }
                c.fChar = nextCharLL();
            }
        }

        //
        //  check for backslash escaped characters.
        //
        if (c.fChar == chBackSlash) {
            int64_t pos = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
            if (RegexStaticSets::gStaticSets->fUnescapeCharSet.contains(peekCharLL())) {
                //
                // A '\' sequence that is handled by ICU's standard unescapeAt function.
                //   Includes \uxxxx, \n, \r, many others.
                //   Return the single equivalent character.
                //
                nextCharLL();                 // get & discard the peeked char.
                c.fQuoted = TRUE;

                if (UTEXT_FULL_TEXT_IN_CHUNK(fRXPat->fPattern, fPatternLength)) {
                    int32_t endIndex = (int32_t)pos;
                    c.fChar = u_unescapeAt(uregex_ucstr_unescape_charAt, &endIndex, (int32_t)fPatternLength, (void *)fRXPat->fPattern->chunkContents);

                    if (endIndex == pos) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    }
                    fCharNum += endIndex - pos;
                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, endIndex);
                } else {
                    int32_t offset = 0;
                    struct URegexUTextUnescapeCharContext context = U_REGEX_UTEXT_UNESCAPE_CONTEXT(fRXPat->fPattern);

                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, pos);
                    c.fChar = u_unescapeAt(uregex_utext_unescape_charAt, &offset, INT32_MAX, &context);

                    if (offset == 0) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    } else if (context.lastOffset == offset) {
                        UTEXT_PREVIOUS32(fRXPat->fPattern);
                    } else if (context.lastOffset != offset-1) {
                        utext_moveIndex32(fRXPat->fPattern, offset - context.lastOffset - 1);
                    }
                    fCharNum += offset;
                }
            }
            else if (peekCharLL() == chDigit0) {
                //  Octal Escape, using Java Regexp Conventions
                //    which are \0 followed by 1-3 octal digits.
                //    Different from ICU Unescape handling of Octal, which does not
                //    require the leading 0.
                //  Java also has the convention of only consuming 2 octal digits if
                //    the three digit number would be > 0xff
                //
                c.fChar = 0;
                nextCharLL();    // Consume the initial 0.
                int index;
                for (index=0; index<3; index++) {
                    int32_t ch = peekCharLL();
                    if (ch<chDigit0 || ch>chDigit7) {
                        if (index==0) {
                           // \0 is not followed by any octal digits.
                           error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                        }
                        break;
                    }
                    c.fChar <<= 3;
                    c.fChar += ch&7;
                    if (c.fChar <= 255) {
                        nextCharLL();
                    } else {
                        // The last digit made the number too big.  Forget we saw it.
                        c.fChar >>= 3;
                    }
                }
                c.fQuoted = TRUE;
            }
            else if (peekCharLL() == chQ) {
                //  "\Q"  enter quote mode, which will continue until "\E"
                fQuoteMode = TRUE;
                nextCharLL();       // discard the 'Q'.
                nextChar(c);        // recurse to get the real next char.
            }
            else
            {
                // We are in a '\' escape that will be handled by the state table scanner.
                // Just return the backslash, but remember that the following char is to
                //  be taken literally.
                fInBackslashQuote = TRUE;
            }
        }
    }

    // re-enable # to end-of-line comments, in case they were disabled.
    // They are disabled by the parser upon seeing '(?', but this lasts for
    //  the fetching of the next character only.
    fEOLComments = TRUE;

    // putc(c.fChar, stdout);
}